

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

int32_t type_trait_count(ecs_type_t type,ecs_entity_t trait)

{
  ulong uVar1;
  int32_t iVar2;
  void *pvVar3;
  ecs_entity_t e;
  int32_t result;
  ecs_entity_t *entities;
  int32_t count;
  int32_t i;
  ecs_entity_t trait_local;
  ecs_type_t type_local;
  
  iVar2 = ecs_vector_count(type);
  pvVar3 = _ecs_vector_first(type,8,0x10);
  e._4_4_ = 0;
  for (entities._4_4_ = 0; entities._4_4_ < iVar2; entities._4_4_ = entities._4_4_ + 1) {
    uVar1 = *(ulong *)((long)pvVar3 + (long)entities._4_4_ * 8);
    if (((uVar1 & 0xff00000000000000) == 0xfa00000000000000) &&
       ((uVar1 & 0xffffffffffffff) >> 0x20 == (trait & 0xffffffffffffff))) {
      e._4_4_ = e._4_4_ + 1;
    }
  }
  return e._4_4_;
}

Assistant:

static
int32_t type_trait_count(
    ecs_type_t type,
    ecs_entity_t trait)
{
    int32_t i, count = ecs_vector_count(type);
    ecs_entity_t *entities = ecs_vector_first(type, ecs_entity_t);
    int32_t result = 0;

    trait &= ECS_COMPONENT_MASK;

    for (i = 0; i < count; i ++) {
        ecs_entity_t e = entities[i];
        if (ECS_HAS_ROLE(e, TRAIT)) {
            e &= ECS_COMPONENT_MASK;
            if (ecs_entity_t_hi(e) == trait) {
                result ++;
            }
        }
    }

    return result;
}